

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int cmp(void *param_1,void *param_2)

{
  int iVar1;
  int in_stack_00000018;
  int in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000024;
  int in_stack_00000038;
  int in_stack_0000003c;
  int in_stack_00000040;
  int in_stack_00000044;
  
  iVar1 = in_stack_00000044 + in_stack_0000003c + in_stack_00000040 + in_stack_00000038;
  return CONCAT31((int3)((uint)iVar1 >> 8),
                  iVar1 < in_stack_00000024 + in_stack_0000001c +
                          in_stack_00000020 + in_stack_00000018);
}

Assistant:

bool cmp(Student x ,Student y)
{
    int sumx = 0;
    int sumy = 0;
    for (int i = 0; i < 4; ++i) {
        sumx += x.socre[i];
        sumy += y.socre[i];
    }
    return sumx > sumy;
}